

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::apps::App::generateParser(App *this)

{
  Option *this_00;
  pointer phVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Option *__s;
  App *this_02;
  long in_RSI;
  __uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
  in_RDI;
  __single_object *app;
  Validator *in_stack_fffffffffffffd50;
  Validator *in_stack_fffffffffffffd68;
  Validator *in_stack_fffffffffffffd70;
  allocator<char> *in_stack_fffffffffffffd80;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  Validator *validator;
  char (*in_stack_fffffffffffffde0) [13];
  char (*in_stack_fffffffffffffde8) [35];
  allocator<char> local_1f1 [9];
  string *in_stack_fffffffffffffe18;
  bool *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  helicsCLI11App *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  App *in_stack_fffffffffffffe70;
  allocator<char> local_111 [40];
  undefined1 local_e9 [80];
  allocator<char> local_99 [40];
  allocator<char> local_71 [40];
  allocator<char> local_49 [56];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_unique<helics::helicsCLI11App,char_const(&)[35],char_const(&)[13]>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x178832);
  helicsCLI11App::add_config_validation(in_stack_fffffffffffffe30);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x178849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&in_stack_fffffffffffffe30->super_App,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_71);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_49);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x178933);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  this_00 = (Option *)(in_RSI + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)(local_e9 + 0x28));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_99);
  phVar1 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x178a0b);
  validator = (Validator *)local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  __s = CLI::App::
        add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe58);
  CLI::Validator::Validator(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  __a = (allocator<char> *)&stack0xfffffffffffffe5f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  CLI::Option::check(this_00,validator,(string *)phVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe5f);
  CLI::Validator::~Validator(in_stack_fffffffffffffd50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_111);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)local_e9);
  phVar1 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x178b68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  CLI::Option::capture_default_str((Option *)phVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_1f1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
  phVar1 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x178c4b);
  this_02 = CLI::App::allow_extras(&phVar1->super_App,true);
  CLI::App::validate_positionals(this_02,true);
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(tuple<helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>)
           in_RDI.
           super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
           .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<helicsCLI11App> App::generateParser()
{
    auto app =
        std::make_unique<helicsCLI11App>("Common options for all Helics Apps", "[HELICS_APP]");
    app->add_config_validation();
    app->add_flag("--local",
                  useLocal,
                  "Specify otherwise unspecified endpoints and publications as local "
                  "(i.e. the names will be prepended with the app name)");
    app->add_option("--stop", stopTime, "The time to stop the app");
    app->add_option("--input,input",
                    inputFileName,
                    "The primary input file containing app configuration")
        ->check(CLI::ExistingFile);
    app->add_option("--output,-o", outFileName, "the output file for recording the data")
        ->capture_default_str();
    app->allow_extras()->validate_positionals();
    return app;
}